

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O1

void __thiscall
Test_TemplateModifiers_PreEscape::Test_TemplateModifiers_PreEscape
          (Test_TemplateModifiers_PreEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, PreEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestPreEscape", NULL);
  dict.SetEscapedValue("easy PRE", "foo",
                       GOOGLE_NAMESPACE::pre_escape);
  dict.SetEscapedValue("harder PRE", "foo & bar",
                       GOOGLE_NAMESPACE::pre_escape);
  dict.SetEscapedValue("hardest PRE",
                       " \"--\v--\f--\n--\t--&--<-->--'--\"",
                       GOOGLE_NAMESPACE::pre_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy PRE"), "foo");
  EXPECT_STREQ(peer.GetSectionValue("harder PRE"), "foo &amp; bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest PRE"),
               " &quot;--\v--\f--\n--\t--&amp;--&lt;--&gt;--&#39;--&quot;");
}